

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O2

void duckdb_zstd::ZSTD_CCtxParams_init_internal
               (ZSTD_CCtx_params *cctxParams,ZSTD_parameters *params,int compressionLevel)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  ZSTD_strategy ZVar7;
  int iVar8;
  ZSTD_paramSwitch_e ZVar9;
  ZSTD_paramSwitch_e ZVar10;
  
  switchD_014c69ad::default(cctxParams,0,0xd8);
  uVar1 = (params->cParams).chainLog;
  uVar2 = (params->cParams).hashLog;
  uVar3 = (params->cParams).searchLog;
  uVar4 = (params->cParams).searchLog;
  uVar5 = (params->cParams).minMatch;
  uVar6 = (params->cParams).targetLength;
  ZVar7 = (params->cParams).strategy;
  (cctxParams->cParams).windowLog = (params->cParams).windowLog;
  (cctxParams->cParams).chainLog = uVar1;
  (cctxParams->cParams).hashLog = uVar2;
  (cctxParams->cParams).searchLog = uVar3;
  (cctxParams->cParams).searchLog = uVar4;
  (cctxParams->cParams).minMatch = uVar5;
  (cctxParams->cParams).targetLength = uVar6;
  (cctxParams->cParams).strategy = ZVar7;
  iVar8 = (params->fParams).checksumFlag;
  (cctxParams->fParams).contentSizeFlag = (params->fParams).contentSizeFlag;
  (cctxParams->fParams).checksumFlag = iVar8;
  (cctxParams->fParams).noDictIDFlag = (params->fParams).noDictIDFlag;
  cctxParams->compressionLevel = compressionLevel;
  ZVar9 = ZSTD_resolveRowMatchFinderMode(ZSTD_ps_auto,&params->cParams);
  cctxParams->useRowMatchFinder = ZVar9;
  ZVar10 = ZSTD_ps_disable;
  ZVar9 = ZVar10;
  if (6 < (int)(params->cParams).strategy) {
    ZVar9 = ((params->cParams).windowLog < 0x11) + ZSTD_ps_enable;
  }
  cctxParams->useBlockSplitter = ZVar9;
  if (6 < (int)(params->cParams).strategy) {
    ZVar10 = ((params->cParams).windowLog < 0x1b) + ZSTD_ps_enable;
  }
  (cctxParams->ldmParams).enableLdm = ZVar10;
  cctxParams->maxBlockSize = 0x20000;
  cctxParams->searchForExternalRepcodes = (compressionLevel < 10) + ZSTD_ps_enable;
  return;
}

Assistant:

static void
ZSTD_CCtxParams_init_internal(ZSTD_CCtx_params* cctxParams,
                        const ZSTD_parameters* params,
                              int compressionLevel)
{
    assert(!ZSTD_checkCParams(params->cParams));
    ZSTD_memset(cctxParams, 0, sizeof(*cctxParams));
    cctxParams->cParams = params->cParams;
    cctxParams->fParams = params->fParams;
    /* Should not matter, as all cParams are presumed properly defined.
     * But, set it for tracing anyway.
     */
    cctxParams->compressionLevel = compressionLevel;
    cctxParams->useRowMatchFinder = ZSTD_resolveRowMatchFinderMode(cctxParams->useRowMatchFinder, &params->cParams);
    cctxParams->useBlockSplitter = ZSTD_resolveBlockSplitterMode(cctxParams->useBlockSplitter, &params->cParams);
    cctxParams->ldmParams.enableLdm = ZSTD_resolveEnableLdm(cctxParams->ldmParams.enableLdm, &params->cParams);
    cctxParams->validateSequences = ZSTD_resolveExternalSequenceValidation(cctxParams->validateSequences);
    cctxParams->maxBlockSize = ZSTD_resolveMaxBlockSize(cctxParams->maxBlockSize);
    cctxParams->searchForExternalRepcodes = ZSTD_resolveExternalRepcodeSearch(cctxParams->searchForExternalRepcodes, compressionLevel);
    DEBUGLOG(4, "ZSTD_CCtxParams_init_internal: useRowMatchFinder=%d, useBlockSplitter=%d ldm=%d",
                cctxParams->useRowMatchFinder, cctxParams->useBlockSplitter, cctxParams->ldmParams.enableLdm);
}